

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O3

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob)

{
  int *piVar1;
  size_t __size;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  undefined4 in_EAX;
  int q;
  int iVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  size_t totalsize;
  
  iVar8 = bottom_blob->w;
  iVar13 = bottom_blob->h;
  iVar6 = bottom_blob->c;
  uVar18 = iVar13 * iVar8;
  auVar21._0_4_ = -(uint)(top_blob->dims == 3);
  auVar21._4_4_ = -(uint)(iVar8 == top_blob->w);
  auVar21._8_4_ = -(uint)(iVar13 == top_blob->h);
  auVar21._12_4_ = -(uint)(iVar6 == top_blob->c);
  iVar7 = movmskps(in_EAX,auVar21);
  if ((iVar7 == 0xf) && (top_blob->elemsize == 4)) {
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    sVar15 = top_blob->cstep;
    iVar8 = iVar6;
  }
  else {
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = iVar8;
    top_blob->h = iVar13;
    top_blob->c = iVar6;
    sVar15 = (long)(int)uVar18 + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar15;
    lVar14 = (long)iVar6 * sVar15;
    if (lVar14 == 0) {
      return -100;
    }
    pvVar9 = malloc(lVar14 * 4 + 0x1c);
    pvVar11 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar11 - 8) = pvVar9;
    top_blob->data = pvVar11;
    piVar1 = (int *)((long)pvVar11 + lVar14 * 4);
    top_blob->refcount = piVar1;
    *piVar1 = 1;
    iVar8 = top_blob->c;
  }
  iVar13 = -100;
  if (((long)iVar8 * sVar15 != 0) && (iVar6 != 0)) {
    lVar14 = (long)iVar6;
    __size = lVar14 * 4 + 0x1c;
    pvVar9 = malloc(__size);
    uVar12 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
    *(void **)(uVar12 - 8) = pvVar9;
    *(undefined4 *)(uVar12 + lVar14 * 4) = 1;
    uVar19 = (ulong)uVar18;
    if (0 < iVar6) {
      pvVar9 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      lVar10 = 0;
      do {
        fVar20 = 0.0;
        if (0 < (int)uVar18) {
          uVar16 = 0;
          do {
            fVar20 = fVar20 + *(float *)((long)pvVar9 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
        }
        *(float *)(uVar12 + lVar10 * 4) = fVar20;
        lVar10 = lVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
      } while (lVar10 != lVar14);
      if (this->across_channels == 0) {
        if (0 < iVar6) {
          pvVar9 = bottom_blob->data;
          sVar3 = bottom_blob->cstep;
          pvVar11 = top_blob->data;
          sVar4 = top_blob->elemsize;
          sVar5 = bottom_blob->elemsize;
          lVar10 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar20 = *(float *)(uVar12 + lVar10 * 4);
              uVar16 = 0;
              do {
                *(float *)((long)pvVar11 + uVar16 * 4) =
                     *(float *)((long)pvVar9 + uVar16 * 4) - fVar20 * (1.0 / (float)(int)uVar18);
                uVar16 = uVar16 + 1;
              } while (uVar19 != uVar16);
            }
            lVar10 = lVar10 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar15);
            pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar5);
          } while (lVar10 != lVar14);
        }
      }
      else if (0 < iVar6) {
        fVar20 = 0.0;
        lVar10 = 0;
        do {
          fVar20 = fVar20 + *(float *)(uVar12 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar14 != lVar10);
        if (0 < iVar6) {
          sVar3 = bottom_blob->cstep;
          sVar4 = bottom_blob->elemsize;
          pvVar9 = bottom_blob->data;
          pvVar11 = top_blob->data;
          lVar10 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar16 = 0;
              do {
                *(float *)((long)pvVar11 + uVar16 * 4) =
                     *(float *)((long)pvVar9 + uVar16 * 4) - fVar20 / (float)(int)(iVar6 * uVar18);
                uVar16 = uVar16 + 1;
              } while (uVar19 != uVar16);
            }
            lVar10 = lVar10 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar15 * 4);
            pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
          } while (lVar10 != lVar14);
        }
      }
    }
    if (this->normalize_variance != 0) {
      pvVar9 = malloc(__size);
      uVar16 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar16 - 8) = pvVar9;
      *(undefined4 *)(uVar16 + lVar14 * 4) = 1;
      if (0 < iVar6) {
        pvVar9 = top_blob->data;
        sVar3 = top_blob->elemsize;
        lVar10 = 0;
        do {
          fVar20 = 0.0;
          if (0 < (int)uVar18) {
            uVar17 = 0;
            do {
              fVar2 = *(float *)((long)pvVar9 + uVar17 * 4);
              fVar20 = fVar20 + fVar2 * fVar2;
              uVar17 = uVar17 + 1;
            } while (uVar19 != uVar17);
          }
          *(float *)(uVar16 + lVar10 * 4) = fVar20;
          lVar10 = lVar10 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar15);
        } while (lVar10 != lVar14);
        if (this->across_channels == 0) {
          if (0 < iVar6) {
            pvVar9 = top_blob->data;
            sVar3 = top_blob->elemsize;
            lVar10 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar20 = *(float *)(uVar16 + lVar10 * 4);
                fVar2 = this->eps;
                uVar17 = 0;
                do {
                  *(float *)((long)pvVar9 + uVar17 * 4) =
                       *(float *)((long)pvVar9 + uVar17 * 4) *
                       (1.0 / (SQRT(fVar20 * (1.0 / (float)(int)uVar18)) + fVar2));
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              lVar10 = lVar10 + 1;
              pvVar9 = (void *)((long)pvVar9 + sVar15 * sVar3);
            } while (lVar10 != lVar14);
          }
        }
        else if (0 < iVar6) {
          fVar20 = 0.0;
          lVar10 = 0;
          do {
            fVar20 = fVar20 + *(float *)(uVar16 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar14 != lVar10);
          if (0 < iVar6) {
            fVar2 = this->eps;
            sVar3 = top_blob->elemsize;
            pvVar9 = top_blob->data;
            lVar10 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar17 = 0;
                do {
                  *(float *)((long)pvVar9 + uVar17 * 4) =
                       *(float *)((long)pvVar9 + uVar17 * 4) *
                       (1.0 / (SQRT(fVar20 / (float)(int)(iVar6 * uVar18)) + fVar2));
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              lVar10 = lVar10 + 1;
              pvVar9 = (void *)((long)pvVar9 + sVar15 * sVar3);
            } while (lVar10 != lVar14);
          }
        }
      }
      LOCK();
      piVar1 = (int *)(uVar16 + lVar14 * 4);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (uVar16 != 0 && *piVar1 == 0) {
        free(*(void **)(uVar16 - 8));
      }
    }
    LOCK();
    piVar1 = (int *)(uVar12 + lVar14 * 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    iVar13 = 0;
    if (uVar12 != 0 && *piVar1 == 0) {
      free(*(void **)(uVar12 - 8));
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    top_blob.create(w, h, channels);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels);
    if (sum.empty())
        return -100;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}